

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * hashToDir(string *__return_storage_ptr__,string *hash_code)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar2 = std::__cxx11::string::compare((char *)hash_code);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,STAGE_DIR_abi_cxx11_._M_dataplus._M_p,
               STAGE_DIR_abi_cxx11_._M_dataplus._M_p + STAGE_DIR_abi_cxx11_._M_string_length);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)hash_code);
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,".","");
    }
    else {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,COMMITS_DIR_abi_cxx11_._M_dataplus._M_p,
                 COMMITS_DIR_abi_cxx11_._M_dataplus._M_p + COMMITS_DIR_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)local_40);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_40,(ulong)(hash_code->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String hashToDir(String hash_code){
    if(hash_code == "Stage"){
        return STAGE_DIR;
    }
    if(hash_code == "Work"){
        return ".";
    }
    return COMMITS_DIR + "/" + hash_code;
}